

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O3

void __thiscall
LumaQuantizer::setQuantizer
          (LumaQuantizer *this,ptf_t ptf,uint bitdepth,colorSpace_t cs,uint bitdepthC,float maxLum,
          float minLum)

{
  uint uVar1;
  undefined1 auVar2 [16];
  float *__dest;
  ulong uVar3;
  float *__src;
  float *pfVar4;
  ulong uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  if (this->m_mapping != (float *)0x0) {
    operator_delete__(this->m_mapping);
  }
  this->m_bitdepth = bitdepth;
  fVar6 = exp2f((float)bitdepth);
  this->m_maxVal = (int)fVar6 - 1;
  this->m_colorSpace = cs;
  this->m_bitdepthColor = bitdepthC;
  fVar6 = exp2f((float)bitdepthC);
  this->m_maxValColor = (int)fVar6 - 1;
  this->m_Lmax = maxLum;
  this->m_Lmin = minLum;
  uVar1 = this->m_maxVal;
  uVar5 = (ulong)uVar1;
  __dest = (float *)operator_new__((ulong)(uVar1 + 1) << 2);
  this->m_mapping = __dest;
  auVar2 = _DAT_0019d2d0;
  switch(ptf) {
  case PTF_PQ:
    setMappingPQ(this);
    return;
  case PTF_LOG:
    setMappingLog(this);
    return;
  case PTF_JND_HDRVDP:
    uVar1 = this->m_bitdepth;
    pfVar4 = ptf_jnd_hdrvdp_12bit;
    if (uVar1 == 0xb) {
      pfVar4 = ptf_jnd_hdrvdp_11bit;
    }
    __src = ptf_jnd_hdrvdp_10bit;
    break;
  case PTF_LINEAR:
    auVar7._4_4_ = 0;
    auVar7._0_4_ = uVar1;
    auVar7._8_4_ = uVar1;
    auVar7._12_4_ = 0;
    uVar3 = 0;
    auVar7 = auVar7 ^ _DAT_0019d2d0;
    auVar8 = _DAT_0019d2c0;
    do {
      auVar10 = auVar8 ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        __dest[uVar3] = ((float)(long)uVar3 / (float)uVar5) * maxLum;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        __dest[uVar3 + 1] = ((float)(long)(uVar3 + 1) / (float)uVar5) * maxLum;
      }
      uVar3 = uVar3 + 2;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
    } while ((uVar5 + 2 & 0xfffffffffffffffe) != uVar3);
    return;
  default:
    uVar1 = this->m_bitdepth;
    pfVar4 = ptf_jnd_ferwerda_12bit;
    if (uVar1 == 0xb) {
      pfVar4 = ptf_jnd_ferwerda_11bit;
    }
    __src = ptf_jnd_ferwerda_10bit;
  }
  if (uVar1 != 10) {
    __src = pfVar4;
  }
  memcpy(__dest,__src,uVar5 * 4 + 4);
  return;
}

Assistant:

void LumaQuantizer::setQuantizer(ptf_t ptf, unsigned int bitdepth,
                                 colorSpace_t cs, unsigned int bitdepthC,
                                 float maxLum, float minLum)
{
    if (m_mapping != NULL)
        delete[] m_mapping;
    
    m_bitdepth = bitdepth;
    m_maxVal = (int)pow(2.0f,(float)bitdepth)-1;
    m_colorSpace = cs;
    m_bitdepthColor = bitdepthC;
    m_maxValColor = (int)pow(2.0f,(float)bitdepthC)-1;
    m_Lmax = maxLum;
    m_Lmin = minLum;
    
    m_mapping = new float[m_maxVal+1];
    
    switch (ptf)
    {
    case PTF_PQ:
        setMappingPQ();
        break;
    case PTF_LOG:
        setMappingLog();
        break;
    case PTF_JND_HDRVDP:
        setMappingJNDHDRVDP();
        break;
    case PTF_LINEAR:
        for (size_t i=0; i<=m_maxVal; i++)
	        m_mapping[i] = m_Lmax*((float)i/m_maxVal);
	    break;
    case PTF_PSI:
    default:
        setMappingPsi();
        break;
    }
    
    //for (int i = 0; i<=m_maxVal; i++)
    //    fprintf(stderr, "%0.8f, ", m_mapping[i]);
}